

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O2

void __thiscall topk_algorithms::TopK::sort(TopK *this)

{
  std::
  __sort<__gnu_cxx::__normal_iterator<rank::KeyValue*,std::vector<rank::KeyValue,std::allocator<rank::KeyValue>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(rank::KeyValue_const&,rank::KeyValue_const&)>>
            ((this->_entries).super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (this->_entries).super__Vector_base<rank::KeyValue,_std::allocator<rank::KeyValue>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_rank::KeyValue_&,_const_rank::KeyValue_&)>)0x10fdf9);
  return;
}

Assistant:

void TopK::sort() {
        std::sort(_entries.begin(), _entries.end(), topk_sort_cmp);
    }